

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O3

RegEx * YAML::Exp::KeyInFlow(void)

{
  int iVar1;
  RegEx *ex2;
  RegEx RStack_28;
  
  if (KeyInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&KeyInFlow()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(&RStack_28,'?');
      ex2 = BlankOrBreak();
      operator+(&KeyInFlow::e,&RStack_28,ex2);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&RStack_28.m_params);
      __cxa_atexit(RegEx::~RegEx,&KeyInFlow::e,&__dso_handle);
      __cxa_guard_release(&KeyInFlow()::e);
    }
  }
  return &KeyInFlow::e;
}

Assistant:

inline const RegEx& KeyInFlow() {
  static const RegEx e = RegEx('?') + BlankOrBreak();
  return e;
}